

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse_internal(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *this,bool keep,
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *result)

{
  byte bVar1;
  bool bVar2;
  number_unsigned_t v;
  number_integer_t v_00;
  undefined8 uVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDX;
  byte in_SIL;
  int *in_RDI;
  number_float_t v_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_bool>
  pVar4;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_000000b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  k;
  bool keep_tag;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value;
  string_t key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe94;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  string_t *in_stack_fffffffffffffea8;
  value_t t;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  value_t in_stack_fffffffffffffedf;
  json_value *in_stack_fffffffffffffee0;
  string *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  json_value local_d0;
  json_value local_c8;
  json_value local_c0;
  json_value local_b8;
  json_value local_b0;
  json_value local_a8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_a0;
  json_value local_90;
  _Base_ptr local_88;
  undefined1 local_80;
  byte local_61;
  int local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_50;
  string local_40 [32];
  json_value in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  bVar2 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_discarded(in_RDX);
  if (!bVar2) {
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38));
    in_RDX->m_type = discarded;
  }
  t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  switch(in_RDI[10]) {
  case 1:
    in_RDX->m_type = boolean;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::json_value((json_value *)&local_b0.boolean,true);
    in_RDX->m_value = local_b0;
    break;
  case 2:
    in_RDX->m_type = boolean;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::json_value((json_value *)&local_b8.boolean,false);
    in_RDX->m_value = local_b8;
    break;
  case 3:
    in_RDX->m_type = null;
    break;
  case 4:
    in_RDX->m_type = string;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::move_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)(in_RDI + 0xc));
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::json_value
              ((json_value *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT15(in_stack_fffffffffffffe95,
                                          CONCAT14(in_stack_fffffffffffffe94,
                                                   in_stack_fffffffffffffe90)))),
               in_stack_fffffffffffffe88);
    in_RDX->m_value = local_a8;
    break;
  case 5:
    in_RDX->m_type = number_unsigned;
    v = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_number_unsigned
                  ((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)(in_RDI + 0xc));
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::json_value((json_value *)&local_c0.boolean,v);
    in_RDX->m_value = local_c0;
    break;
  case 6:
    in_RDX->m_type = number_integer;
    v_00 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::get_number_integer
                     ((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)(in_RDI + 0xc));
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::json_value((json_value *)&local_c8.boolean,v_00);
    in_RDX->m_value = local_c8;
    break;
  case 7:
    in_RDX->m_type = number_float;
    v_01 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::get_number_float((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)(in_RDI + 0xc));
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::json_value((json_value *)&local_d0.boolean,v_01);
    in_RDX->m_value = local_d0;
    bVar2 = std::isfinite((in_RDX->m_value).number_float);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      if ((*(byte *)(in_RDI + 0x2e) & 1) != 0) {
        uVar3 = __cxa_allocate_exception(0x20);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string(in_stack_000000b8);
        std::operator+((char *)in_stack_fffffffffffffe98._M_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,
                                         CONCAT15(in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           in_stack_fffffffffffffe90)))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe98._M_node,
                       (char *)CONCAT17(in_stack_fffffffffffffe97,
                                        CONCAT16(in_stack_fffffffffffffe96,
                                                 CONCAT15(in_stack_fffffffffffffe95,
                                                          CONCAT14(in_stack_fffffffffffffe94,
                                                                   in_stack_fffffffffffffe90)))));
        out_of_range::create(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
        __cxa_throw(uVar3,&out_of_range::typeinfo,out_of_range::~out_of_range);
      }
      expect((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)in_stack_fffffffffffffe98._M_node,
             CONCAT13(in_stack_fffffffffffffe97,
                      CONCAT12(in_stack_fffffffffffffe96,
                               CONCAT11(in_stack_fffffffffffffe95,in_stack_fffffffffffffe94))));
    }
    break;
  case 8:
    if ((bVar1 & 1) != 0) {
      bVar2 = std::function::operator_cast_to_bool
                        ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95,
                                                       CONCAT14(in_stack_fffffffffffffe94,
                                                                in_stack_fffffffffffffe90)))));
      if (bVar2) {
        *in_RDI = *in_RDI + 1;
        bVar1 = std::
                function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                              *)CONCAT17(in_stack_fffffffffffffea7,
                                         CONCAT16(in_stack_fffffffffffffea6,
                                                  in_stack_fffffffffffffea0)),
                             (int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                             (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT15(in_stack_fffffffffffffe95,
                                                           CONCAT14(in_stack_fffffffffffffe94,
                                                                    in_stack_fffffffffffffe90)))));
      }
      bVar2 = std::function::operator_cast_to_bool
                        ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95,
                                                       CONCAT14(in_stack_fffffffffffffe94,
                                                                in_stack_fffffffffffffe90)))));
      if ((!bVar2) || ((bVar1 & 1) != 0)) {
        in_RDX->m_type = array;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::json_value(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
        in_RDX->m_value = local_90;
      }
    }
    get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT15(in_stack_fffffffffffffe95,
                                            CONCAT14(in_stack_fffffffffffffe94,
                                                     in_stack_fffffffffffffe90)))));
    t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
    if (in_RDI[10] == 10) {
      bVar2 = std::function::operator_cast_to_bool
                        ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95,
                                                       CONCAT14(in_stack_fffffffffffffe94,
                                                                in_stack_fffffffffffffe90)))));
      if (bVar2) {
        *in_RDI = *in_RDI + -1;
        bVar2 = std::
                function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                              *)CONCAT17(in_stack_fffffffffffffea7,
                                         CONCAT16(in_stack_fffffffffffffea6,
                                                  in_stack_fffffffffffffea0)),
                             (int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                             (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT15(in_stack_fffffffffffffe95,
                                                           CONCAT14(in_stack_fffffffffffffe94,
                                                                    in_stack_fffffffffffffe90)))));
        if (!bVar2) {
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy
                    ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),t);
          in_RDX->m_type = discarded;
        }
      }
      break;
    }
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)CONCAT17(in_stack_fffffffffffffe97,
                             CONCAT16(in_stack_fffffffffffffe96,
                                      CONCAT15(in_stack_fffffffffffffe95,
                                               CONCAT14(in_stack_fffffffffffffe94,
                                                        in_stack_fffffffffffffe90)))),
                 in_stack_fffffffffffffe88);
    while( true ) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy
                ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                 (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38));
      local_a0.m_type = discarded;
      parse_internal((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)CONCAT17(bVar1,in_stack_fffffffffffffff0),SUB81((ulong)in_RDX >> 0x38,0),
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)in_stack_ffffffffffffffe0.object);
      t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
      if ((*(byte *)(in_RDI + 0x2c) & 1) != 0) break;
      if (((bVar1 & 1) != 0) &&
         (bVar2 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::is_discarded(&local_a0), !bVar2)) {
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::push_back((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,
                                         CONCAT15(in_stack_fffffffffffffe95,
                                                  CONCAT14(in_stack_fffffffffffffe94,
                                                           in_stack_fffffffffffffe90)))),
                    (value_type *)in_stack_fffffffffffffe88);
      }
      get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))));
      t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
      if (in_RDI[10] != 0xd) {
        in_stack_fffffffffffffe94 =
             expect((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)in_stack_fffffffffffffe98._M_node,
                    CONCAT13(in_stack_fffffffffffffe97,
                             CONCAT12(in_stack_fffffffffffffe96,
                                      CONCAT11(in_stack_fffffffffffffe95,in_stack_fffffffffffffe94))
                            ));
        if ((bool)in_stack_fffffffffffffe94) {
          if (((bVar1 & 1) != 0) &&
             (bVar2 = std::function::operator_cast_to_bool
                                ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                                  *)CONCAT17(in_stack_fffffffffffffe97,
                                             CONCAT16(in_stack_fffffffffffffe96,
                                                      CONCAT15(in_stack_fffffffffffffe95,
                                                               CONCAT14(in_stack_fffffffffffffe94,
                                                                        in_stack_fffffffffffffe90)))
                                            )), bVar2)) {
            *in_RDI = *in_RDI + -1;
            bVar2 = std::
                    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                    ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                                  *)CONCAT17(in_stack_fffffffffffffea7,
                                             CONCAT16(in_stack_fffffffffffffea6,
                                                      in_stack_fffffffffffffea0)),
                                 (int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                                 (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)CONCAT17(in_stack_fffffffffffffe97,
                                             CONCAT16(in_stack_fffffffffffffe96,
                                                      CONCAT15(in_stack_fffffffffffffe95,
                                                               CONCAT14(in_stack_fffffffffffffe94,
                                                                        in_stack_fffffffffffffe90)))
                                            ));
            in_stack_fffffffffffffe90 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe90);
            if (!bVar2) {
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy
                        ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
                         ,t);
              in_RDX->m_type = discarded;
            }
          }
          local_60 = 2;
        }
        else {
          local_60 = 1;
        }
        goto LAB_0014a8af;
      }
      get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))));
    }
    local_60 = 1;
LAB_0014a8af:
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)CONCAT17(in_stack_fffffffffffffe97,
                              CONCAT16(in_stack_fffffffffffffe96,
                                       CONCAT15(in_stack_fffffffffffffe95,
                                                CONCAT14(in_stack_fffffffffffffe94,
                                                         in_stack_fffffffffffffe90)))));
    goto joined_r0x0014a5b3;
  case 9:
    if ((bVar1 & 1) != 0) {
      bVar2 = std::function::operator_cast_to_bool
                        ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95,
                                                       CONCAT14(in_stack_fffffffffffffe94,
                                                                in_stack_fffffffffffffe90)))));
      if (bVar2) {
        *in_RDI = *in_RDI + 1;
        bVar1 = std::
                function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                              *)CONCAT17(in_stack_fffffffffffffea7,
                                         CONCAT16(in_stack_fffffffffffffea6,
                                                  in_stack_fffffffffffffea0)),
                             (int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                             (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT15(in_stack_fffffffffffffe95,
                                                           CONCAT14(in_stack_fffffffffffffe94,
                                                                    in_stack_fffffffffffffe90)))));
      }
      bVar2 = std::function::operator_cast_to_bool
                        ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95,
                                                       CONCAT14(in_stack_fffffffffffffe94,
                                                                in_stack_fffffffffffffe90)))));
      if ((!bVar2) || ((bVar1 & 1) != 0)) {
        in_RDX->m_type = object;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::json_value(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
        in_RDX->m_value = in_stack_ffffffffffffffe0;
      }
    }
    get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT15(in_stack_fffffffffffffe95,
                                            CONCAT14(in_stack_fffffffffffffe94,
                                                     in_stack_fffffffffffffe90)))));
    t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
    if (in_RDI[10] == 0xb) {
      if (((bVar1 & 1) != 0) &&
         (bVar2 = std::function::operator_cast_to_bool
                            ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                              *)CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT15(in_stack_fffffffffffffe95,
                                                           CONCAT14(in_stack_fffffffffffffe94,
                                                                    in_stack_fffffffffffffe90))))),
         bVar2)) {
        *in_RDI = *in_RDI + -1;
        bVar2 = std::
                function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                              *)CONCAT17(in_stack_fffffffffffffea7,
                                         CONCAT16(in_stack_fffffffffffffea6,
                                                  in_stack_fffffffffffffea0)),
                             (int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                             (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT15(in_stack_fffffffffffffe95,
                                                           CONCAT14(in_stack_fffffffffffffe94,
                                                                    in_stack_fffffffffffffe90)))));
        if (!bVar2) {
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy
                    ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),t);
          in_RDX->m_type = discarded;
        }
      }
      break;
    }
    std::__cxx11::string::string(local_40);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)CONCAT17(in_stack_fffffffffffffe97,
                             CONCAT16(in_stack_fffffffffffffe96,
                                      CONCAT15(in_stack_fffffffffffffe95,
                                               CONCAT14(in_stack_fffffffffffffe94,
                                                        in_stack_fffffffffffffe90)))),
                 in_stack_fffffffffffffe88);
    while( true ) {
      t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
      in_stack_fffffffffffffeb7 =
           expect((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)in_stack_fffffffffffffe98._M_node,
                  CONCAT13(in_stack_fffffffffffffe97,
                           CONCAT12(in_stack_fffffffffffffe96,
                                    CONCAT11(in_stack_fffffffffffffe95,in_stack_fffffffffffffe94))))
      ;
      if (!(bool)in_stack_fffffffffffffeb7) break;
      in_stack_fffffffffffffea8 =
           lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::move_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)(in_RDI + 0xc));
      std::__cxx11::string::operator=(local_40,(string *)in_stack_fffffffffffffea8);
      local_61 = 0;
      if ((bVar1 & 1) != 0) {
        bVar2 = std::function::operator_cast_to_bool
                          ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                            *)CONCAT17(in_stack_fffffffffffffe97,
                                       CONCAT16(in_stack_fffffffffffffe96,
                                                CONCAT15(in_stack_fffffffffffffe95,
                                                         CONCAT14(in_stack_fffffffffffffe94,
                                                                  in_stack_fffffffffffffe90)))));
        if (bVar2) {
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)CONCAT17(in_stack_fffffffffffffe97,
                                 CONCAT16(in_stack_fffffffffffffe96,
                                          CONCAT15(in_stack_fffffffffffffe95,
                                                   CONCAT14(in_stack_fffffffffffffe94,
                                                            in_stack_fffffffffffffe90)))),
                     in_stack_fffffffffffffe88);
          in_stack_fffffffffffffea7 =
               std::
               function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                             *)CONCAT17(in_stack_fffffffffffffea7,
                                        CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0
                                                )),
                            (int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                            (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)CONCAT17(in_stack_fffffffffffffe97,
                                        CONCAT16(in_stack_fffffffffffffe96,
                                                 CONCAT15(in_stack_fffffffffffffe95,
                                                          CONCAT14(in_stack_fffffffffffffe94,
                                                                   in_stack_fffffffffffffe90)))));
          local_61 = in_stack_fffffffffffffea7;
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)CONCAT17(in_stack_fffffffffffffe97,
                                    CONCAT16(in_stack_fffffffffffffe96,
                                             CONCAT15(in_stack_fffffffffffffe95,
                                                      CONCAT14(in_stack_fffffffffffffe94,
                                                               in_stack_fffffffffffffe90)))));
        }
        else {
          local_61 = 1;
        }
      }
      get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))));
      in_stack_fffffffffffffea6 =
           expect((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)in_stack_fffffffffffffe98._M_node,
                  CONCAT13(in_stack_fffffffffffffe97,
                           CONCAT12(in_stack_fffffffffffffe96,
                                    CONCAT11(in_stack_fffffffffffffe95,in_stack_fffffffffffffe94))))
      ;
      t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
      if (!(bool)in_stack_fffffffffffffea6) {
        local_60 = 1;
        goto LAB_0014a58f;
      }
      get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))));
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy
                ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                 (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38));
      local_50.m_type = discarded;
      parse_internal((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)CONCAT17(bVar1,in_stack_fffffffffffffff0),SUB81((ulong)in_RDX >> 0x38,0),
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)in_stack_ffffffffffffffe0.object);
      t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
      if ((*(byte *)(in_RDI + 0x2c) & 1) != 0) {
        local_60 = 1;
        goto LAB_0014a58f;
      }
      if ((((bVar1 & 1) != 0) && ((local_61 & 1) != 0)) &&
         (bVar2 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::is_discarded(&local_50), !bVar2)) {
        pVar4 = std::
                map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                ::
                emplace<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                          ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffea7,
                                       CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)
                                      ),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe98._M_node,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)CONCAT17(in_stack_fffffffffffffe97,
                                       CONCAT16(in_stack_fffffffffffffe96,
                                                CONCAT15(in_stack_fffffffffffffe95,
                                                         CONCAT14(in_stack_fffffffffffffe94,
                                                                  in_stack_fffffffffffffe90)))));
        in_stack_fffffffffffffe98 = pVar4.first._M_node;
        in_stack_fffffffffffffe97 = pVar4.second;
        local_88 = in_stack_fffffffffffffe98._M_node;
        local_80 = in_stack_fffffffffffffe97;
      }
      get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))));
      t = (value_t)((ulong)in_stack_fffffffffffffea8 >> 0x38);
      if (in_RDI[10] != 0xd) {
        in_stack_fffffffffffffe96 =
             expect((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)in_stack_fffffffffffffe98._M_node,
                    CONCAT13(in_stack_fffffffffffffe97,
                             CONCAT12(in_stack_fffffffffffffe96,
                                      CONCAT11(in_stack_fffffffffffffe95,in_stack_fffffffffffffe94))
                            ));
        if ((bool)in_stack_fffffffffffffe96) {
          if (((bVar1 & 1) != 0) &&
             (bVar2 = std::function::operator_cast_to_bool
                                ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                                  *)CONCAT17(in_stack_fffffffffffffe97,
                                             CONCAT16(in_stack_fffffffffffffe96,
                                                      CONCAT15(in_stack_fffffffffffffe95,
                                                               CONCAT14(in_stack_fffffffffffffe94,
                                                                        in_stack_fffffffffffffe90)))
                                            )), bVar2)) {
            *in_RDI = *in_RDI + -1;
            in_stack_fffffffffffffe95 =
                 std::
                 function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                 ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                               *)CONCAT17(in_stack_fffffffffffffea7,
                                          CONCAT16(in_stack_fffffffffffffea6,
                                                   in_stack_fffffffffffffea0)),
                              (int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                              (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)CONCAT17(in_stack_fffffffffffffe97,
                                          CONCAT16(in_stack_fffffffffffffe96,
                                                   CONCAT15(in_stack_fffffffffffffe95,
                                                            CONCAT14(in_stack_fffffffffffffe94,
                                                                     in_stack_fffffffffffffe90)))));
            if (!(bool)in_stack_fffffffffffffe95) {
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy
                        ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
                         ,t);
              in_RDX->m_type = discarded;
            }
          }
          local_60 = 2;
        }
        else {
          local_60 = 1;
        }
        goto LAB_0014a58f;
      }
      get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))));
    }
    local_60 = 1;
LAB_0014a58f:
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)CONCAT17(in_stack_fffffffffffffe97,
                              CONCAT16(in_stack_fffffffffffffe96,
                                       CONCAT15(in_stack_fffffffffffffe95,
                                                CONCAT14(in_stack_fffffffffffffe94,
                                                         in_stack_fffffffffffffe90)))));
    std::__cxx11::string::~string(local_40);
joined_r0x0014a5b3:
    if (local_60 == 1) {
      return;
    }
    break;
  default:
    bVar2 = expect((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)in_stack_fffffffffffffe98._M_node,
                   CONCAT13(in_stack_fffffffffffffe97,
                            CONCAT12(in_stack_fffffffffffffe96,
                                     CONCAT11(in_stack_fffffffffffffe95,in_stack_fffffffffffffe94)))
                  );
    goto joined_r0x0014abbd;
  case 0xe:
    bVar2 = expect((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)in_stack_fffffffffffffe98._M_node,
                   CONCAT13(in_stack_fffffffffffffe97,
                            CONCAT12(in_stack_fffffffffffffe96,
                                     CONCAT11(in_stack_fffffffffffffe95,in_stack_fffffffffffffe94)))
                  );
joined_r0x0014abbd:
    if (!bVar2) {
      return;
    }
  }
  if ((((bVar1 & 1) != 0) &&
      (bVar2 = std::function::operator_cast_to_bool
                         ((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)CONCAT17(in_stack_fffffffffffffe97,
                                      CONCAT16(in_stack_fffffffffffffe96,
                                               CONCAT15(in_stack_fffffffffffffe95,
                                                        CONCAT14(in_stack_fffffffffffffe94,
                                                                 in_stack_fffffffffffffe90))))),
      bVar2)) &&
     (bVar2 = std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                            *)CONCAT17(in_stack_fffffffffffffea7,
                                       CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)
                                      ),(int)((ulong)in_stack_fffffffffffffe98._M_node >> 0x20),
                           (parse_event_t)((ulong)in_stack_fffffffffffffe98._M_node >> 0x18),
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)CONCAT17(in_stack_fffffffffffffe97,
                                       CONCAT16(in_stack_fffffffffffffe96,
                                                CONCAT15(in_stack_fffffffffffffe95,
                                                         CONCAT14(in_stack_fffffffffffffe94,
                                                                  in_stack_fffffffffffffe90))))),
     !bVar2)) {
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),t);
    in_RDX->m_type = discarded;
  }
  return;
}

Assistant:

void parse_internal(bool keep, BasicJsonType& result)
{
// never parse after a parse error was detected
assert(not errored);

// start with a discarded value
if (not result.is_discarded())
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}

switch (last_token)
{
case token_type::begin_object:
{
if (keep)
{
if (callback)
{
keep = callback(depth++, parse_event_t::object_start, result);
}

if (not callback or keep)
{
// explicitly set result to object to cope with {}
result.m_type = value_t::object;
result.m_value = value_t::object;
}
}

// read next token
get_token();

// closing } -> we are done
if (last_token == token_type::end_object)
{
if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

// parse values
string_t key;
BasicJsonType value;
while (true)
{
// store key
if (not expect(token_type::value_string))
{
return;
}
key = m_lexer.move_string();

bool keep_tag = false;
if (keep)
{
if (callback)
{
BasicJsonType k(key);
keep_tag = callback(depth, parse_event_t::key, k);
}
else
{
keep_tag = true;
}
}

// parse separator (:)
get_token();
if (not expect(token_type::name_separator))
{
return;
}

// parse and add value
get_token();
value.m_value.destroy(value.m_type);
value.m_type = value_t::discarded;
parse_internal(keep, value);

if (JSON_UNLIKELY(errored))
{
return;
}

if (keep and keep_tag and not value.is_discarded())
{
result.m_value.object->emplace(std::move(key), std::move(value));
}

// comma -> next value
get_token();
if (last_token == token_type::value_separator)
{
get_token();
continue;
}

// closing }
if (not expect(token_type::end_object))
{
return;
}
break;
}

if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

case token_type::begin_array:
{
if (keep)
{
if (callback)
{
keep = callback(depth++, parse_event_t::array_start, result);
}

if (not callback or keep)
{
// explicitly set result to array to cope with []
result.m_type = value_t::array;
result.m_value = value_t::array;
}
}

// read next token
get_token();

// closing ] -> we are done
if (last_token == token_type::end_array)
{
if (callback and not callback(--depth, parse_event_t::array_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

// parse values
BasicJsonType value;
while (true)
{
// parse value
value.m_value.destroy(value.m_type);
value.m_type = value_t::discarded;
parse_internal(keep, value);

if (JSON_UNLIKELY(errored))
{
return;
}

if (keep and not value.is_discarded())
{
result.m_value.array->push_back(std::move(value));
}

// comma -> next value
get_token();
if (last_token == token_type::value_separator)
{
get_token();
continue;
}

// closing ]
if (not expect(token_type::end_array))
{
return;
}
break;
}

if (keep and callback and not callback(--depth, parse_event_t::array_end, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
break;
}

case token_type::literal_null:
{
result.m_type = value_t::null;
break;
}

case token_type::value_string:
{
result.m_type = value_t::string;
result.m_value = m_lexer.move_string();
break;
}

case token_type::literal_true:
{
result.m_type = value_t::boolean;
result.m_value = true;
break;
}

case token_type::literal_false:
{
result.m_type = value_t::boolean;
result.m_value = false;
break;
}

case token_type::value_unsigned:
{
result.m_type = value_t::number_unsigned;
result.m_value = m_lexer.get_number_unsigned();
break;
}

case token_type::value_integer:
{
result.m_type = value_t::number_integer;
result.m_value = m_lexer.get_number_integer();
break;
}

case token_type::value_float:
{
result.m_type = value_t::number_float;
result.m_value = m_lexer.get_number_float();

// throw in case of infinity or NAN
if (JSON_UNLIKELY(not std::isfinite(result.m_value.number_float)))
{
if (allow_exceptions)
{
JSON_THROW(out_of_range::create(406, "number overflow parsing '" +
m_lexer.get_token_string() + "'"));
}
expect(token_type::uninitialized);
}
break;
}

case token_type::parse_error:
{
// using "uninitialized" to avoid "expected" message
if (not expect(token_type::uninitialized))
{
return;
}
break; // LCOV_EXCL_LINE
}

default:
{
// the last token was unexpected; we expected a value
if (not expect(token_type::literal_or_value))
{
return;
}
break; // LCOV_EXCL_LINE
}
}

if (keep and callback and not callback(depth, parse_event_t::value, result))
{
result.m_value.destroy(result.m_type);
result.m_type = value_t::discarded;
}
}